

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

bool __thiscall QWidgetWindow::event(QWidgetWindow *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QWidget *pQVar4;
  ulong uVar5;
  State state_00;
  QEvent *in_RSI;
  QWidgetWindow *in_RDI;
  long in_FS_OFFSET;
  QWidgetWindow *unaff_retaddr;
  QEvent widgetEvent;
  QAccessibleStateChangeEvent ev;
  State state;
  QMouseEvent *in_stack_000000d8;
  QWidgetWindow *in_stack_000000e0;
  QWidget *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  WidgetAttribute in_stack_ffffffffffffff84;
  QWidgetWindow *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QWidgetWindow *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffb8;
  QDragMoveEvent *in_stack_ffffffffffffffc0;
  QWidgetWindow *in_stack_ffffffffffffffc8;
  QWidgetWindow *in_stack_ffffffffffffffd0;
  QDragMoveEvent *in_stack_ffffffffffffffe0;
  QWidgetWindow *in_stack_ffffffffffffffe8;
  QWidgetWindow *in_stack_fffffffffffffff0;
  QWidgetWindow *this_01;
  
  this_01 = *(QWidgetWindow **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x3b3959);
  if (!bVar1) {
    bVar2 = QWindow::event((QEvent *)in_RDI);
    bVar2 = bVar2 & 1;
    goto LAB_003b3d58;
  }
  TVar3 = QEvent::type(in_RSI);
  state_00._4_4_ = 0;
  state_00._0_4_ = TVar3 - MouseButtonPress;
  switch(state_00) {
  case (State)0x0:
  case (State)0x1:
  case (State)0x2:
  case (State)0x3:
    handleMouseEvent(in_stack_000000e0,in_stack_000000d8);
    bVar2 = 1;
    break;
  case (State)0x4:
  case (State)0x5:
  case (State)0x31:
    handleKeyEvent(in_stack_ffffffffffffffb0,
                   (QKeyEvent *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    bVar2 = 1;
    break;
  case (State)0x6:
    handleFocusInEvent(in_RDI,(QFocusEvent *)state_00);
  case (State)0x7:
    QAccessible::State::State((State *)0x3b39ea);
    memset(&stack0xffffffffffffffc8,0xaa,0x28);
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b3a1e);
    QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               &in_stack_ffffffffffffff78->super_QObject,state_00);
    QAccessible::updateAccessibility((QAccessibleEvent *)&stack0xffffffffffffffc8);
    bVar2 = 0;
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&stack0xffffffffffffffc8);
    break;
  case (State)0x8:
  case (State)0x9:
    handleEnterLeaveEvent(this_01,(QEvent *)in_stack_fffffffffffffff0);
    bVar2 = 1;
    break;
  default:
    goto LAB_003b3d07;
  case (State)0xb:
    handleMoveEvent(in_RDI,(QMoveEvent *)state_00);
    bVar2 = 1;
    break;
  case (State)0xc:
    handleResizeEvent((QWidgetWindow *)state_00,
                      (QResizeEvent *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
    ;
    bVar2 = 1;
    break;
  case (State)0x15:
    if (QApplicationPrivate::focus_widget != (QWidget *)0x0) {
      bVar1 = QWidget::testAttribute((QWidget *)state_00,in_stack_ffffffffffffff84);
      if (bVar1) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      QCoreApplication::forwardEvent
                (&QApplicationPrivate::focus_widget->super_QObject,in_RSI,(QEvent *)0x0);
    }
    bVar2 = 1;
    break;
  case (State)0x1d:
    handleWheelEvent(in_stack_fffffffffffffff0,(QWheelEvent *)in_stack_ffffffffffffffe8);
    bVar2 = 1;
    break;
  case (State)0x3a:
    handleDragEnterEvent
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    bVar2 = 1;
    break;
  case (State)0x3b:
    handleDragMoveEvent(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    bVar2 = 1;
    break;
  case (State)0x3c:
    handleDragLeaveEvent(in_RDI,(QDragLeaveEvent *)state_00);
    bVar2 = 1;
    break;
  case (State)0x3d:
    handleDropEvent(in_stack_ffffffffffffffd0,(QDropEvent *)in_stack_ffffffffffffffc8);
    bVar2 = 1;
    break;
  case (State)0x4b:
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b3cca);
    QWidget::repaint(in_stack_ffffffffffffff78);
    bVar2 = 1;
    break;
  case (State)0x50:
    handleContextMenuEvent
              (in_stack_ffffffffffffffb0,
               (QContextMenuEvent *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    bVar2 = 1;
    break;
  case (State)0x55:
  case (State)0x5a:
  case (State)0x5b:
    handleTabletEvent(unaff_retaddr,(QTabletEvent *)this_01);
    bVar2 = 1;
    break;
  case (State)0x65:
    qt_button_down = (QWidget *)0x0;
    goto LAB_003b3d07;
  case (State)0x67:
    QWindow::event((QEvent *)in_RDI);
    handleWindowStateChangedEvent(in_RDI,(QWindowStateChangeEvent *)state_00);
    bVar2 = 1;
    break;
  case (State)0xab:
  case (State)0xac:
  case (State)0xad:
  case (State)0xae:
    handleNonClientAreaMouseEvent
              ((QWidgetWindow *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QMouseEvent *)in_stack_ffffffffffffff78);
    bVar2 = 1;
    break;
  case (State)0xc0:
  case (State)0xc1:
  case (State)0xc2:
  case (State)0xcf:
    handleTouchEvent(in_RDI,(QTouchEvent *)state_00);
    bVar2 = 1;
    break;
  case (State)0xc3:
    handleGestureEvent(this_00,(QNativeGestureEvent *)in_RSI);
    bVar2 = 1;
    break;
  case (State)0xcc:
    handleExposeEvent((QWidgetWindow *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                      ,(QExposeEvent *)this_00);
    bVar2 = 1;
    break;
  case (State)0xd0:
    QEvent::QEvent((QEvent *)&stack0xffffffffffffffb0,ThemeChange);
    pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b3c3b);
    QCoreApplication::forwardEvent(&pQVar4->super_QObject,(QEvent *)&stack0xffffffffffffffb0,in_RSI)
    ;
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffffb0);
    bVar2 = 1;
    break;
  case (State)0xdc:
    handleDevicePixelRatioChange
              ((QWidgetWindow *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    goto LAB_003b3d07;
  case (State)0xe1:
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b3cf3);
    QWidgetPrivate::get((QWidget *)0x3b3cfb);
    QWidgetPrivate::updateContentsRect((QWidgetPrivate *)state_00);
LAB_003b3d07:
    bVar1 = shouldBePropagatedToWidget((QEvent *)in_stack_ffffffffffffff78);
    if (bVar1) {
      pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b3d25);
      uVar5 = QCoreApplication::forwardEvent(&pQVar4->super_QObject,in_RSI,(QEvent *)0x0);
      if ((uVar5 & 1) != 0) {
        bVar2 = 1;
        break;
      }
    }
    bVar2 = QWindow::event((QEvent *)in_RDI);
    bVar2 = bVar2 & 1;
  }
LAB_003b3d58:
  if (*(QWidgetWindow **)(in_FS_OFFSET + 0x28) == this_01) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetWindow::event(QEvent *event)
{
    if (!m_widget)
        return QWindow::event(event);

    switch (event->type()) {
    case QEvent::Enter:
    case QEvent::Leave:
        handleEnterLeaveEvent(event);
        return true;

    // these should not be sent to QWidget, the corresponding events
    // are sent by QApplicationPrivate::notifyActiveWindowChange()
    case QEvent::FocusIn:
        handleFocusInEvent(static_cast<QFocusEvent *>(event));
        Q_FALLTHROUGH();
    case QEvent::FocusOut: {
#if QT_CONFIG(accessibility)
        QAccessible::State state;
        state.active = true;
        QAccessibleStateChangeEvent ev(m_widget, state);
        QAccessible::updateAccessibility(&ev);
#endif
        return false; }

    case QEvent::FocusAboutToChange:
        if (QApplicationPrivate::focus_widget) {
            if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->commit();

            QGuiApplication::forwardEvent(QApplicationPrivate::focus_widget, event);
        }
        return true;

    case QEvent::KeyPress:
    case QEvent::KeyRelease:
    case QEvent::ShortcutOverride:
        handleKeyEvent(static_cast<QKeyEvent *>(event));
        return true;

    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        handleMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
        handleNonClientAreaMouseEvent(static_cast<QMouseEvent *>(event));
        return true;

    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    case QEvent::TouchCancel:
        handleTouchEvent(static_cast<QTouchEvent *>(event));
        return true;

    case QEvent::Move:
        handleMoveEvent(static_cast<QMoveEvent *>(event));
        return true;

    case QEvent::Resize:
        handleResizeEvent(static_cast<QResizeEvent *>(event));
        return true;

#if QT_CONFIG(wheelevent)
    case QEvent::Wheel:
        handleWheelEvent(static_cast<QWheelEvent *>(event));
        return true;
#endif

#if QT_CONFIG(draganddrop)
    case QEvent::DragEnter:
        handleDragEnterEvent(static_cast<QDragEnterEvent *>(event));
        return true;
    case QEvent::DragMove:
        handleDragMoveEvent(static_cast<QDragMoveEvent *>(event));
        return true;
    case QEvent::DragLeave:
        handleDragLeaveEvent(static_cast<QDragLeaveEvent *>(event));
        return true;
    case QEvent::Drop:
        handleDropEvent(static_cast<QDropEvent *>(event));
        return true;
#endif

    case QEvent::Expose:
        handleExposeEvent(static_cast<QExposeEvent *>(event));
        return true;

    case QEvent::WindowStateChange:
        QWindow::event(event); // Update QWindow::Visibility and emit signals.
        handleWindowStateChangedEvent(static_cast<QWindowStateChangeEvent *>(event));
        return true;

    case QEvent::ThemeChange: {
        QEvent widgetEvent(QEvent::ThemeChange);
        QCoreApplication::forwardEvent(m_widget, &widgetEvent, event);
    }
        return true;

#if QT_CONFIG(tabletevent)
    case QEvent::TabletPress:
    case QEvent::TabletMove:
    case QEvent::TabletRelease:
        handleTabletEvent(static_cast<QTabletEvent *>(event));
        return true;
#endif

#ifndef QT_NO_GESTURES
    case QEvent::NativeGesture:
        handleGestureEvent(static_cast<QNativeGestureEvent *>(event));
        return true;
#endif

#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        handleContextMenuEvent(static_cast<QContextMenuEvent *>(event));
        return true;
#endif // QT_NO_CONTEXTMENU

    case QEvent::WindowBlocked:
        qt_button_down = nullptr;
        break;

    case QEvent::UpdateRequest:
        // This is not the same as an UpdateRequest for a QWidget. That just
        // syncs the backing store while here we also must mark as dirty.
        m_widget->repaint();
        return true;

    case QEvent::DevicePixelRatioChange:
        handleDevicePixelRatioChange();
        break;

    case QEvent::SafeAreaMarginsChange:
        QWidgetPrivate::get(m_widget)->updateContentsRect();
        break;

    default:
        break;
    }

    if (shouldBePropagatedToWidget(event) && QCoreApplication::forwardEvent(m_widget, event))
        return true;

    return QWindow::event(event);
}